

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall QCalendarWidget::updateCell(QCalendarWidget *this,QDate date)

{
  long lVar1;
  QRect QVar2;
  QRect QVar3;
  QRect QVar4;
  QWidget *this_00;
  long in_FS_OFFSET;
  int column;
  int row;
  QRect local_60;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  int local_28;
  int local_24;
  long local_20;
  
  QVar2._8_8_ = local_60._8_8_;
  QVar2._0_8_ = local_60._0_8_;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
    if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
      lVar1 = *(long *)&(this->super_QWidget).field_0x8;
      local_24 = -0x55555556;
      local_28 = -0x55555556;
      QtPrivate::QCalendarModel::cellForDate
                (*(QCalendarModel **)(lVar1 + 600),date,&local_24,&local_28);
      QVar2.x2.m_i = local_60.x2.m_i;
      QVar2.y2.m_i = local_60.y2.m_i;
      QVar2.x1.m_i = local_60.x1.m_i;
      QVar2.y1.m_i = local_60.y1.m_i;
      if (local_28 != -1 && local_24 != -1) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_60.x1.m_i = -1;
        local_60.y1.m_i = -1;
        local_60.x2.m_i = 0;
        local_60.y2.m_i = 0;
        uStack_50 = 0;
        (**(code **)(**(long **)(lVar1 + 600) + 0x60))(&local_48);
        QVar4.x2.m_i = local_60.x2.m_i;
        QVar4.y2.m_i = local_60.y2.m_i;
        QVar4.x1.m_i = local_60.x1.m_i;
        QVar4.y1.m_i = local_60.y1.m_i;
        QVar3.x2.m_i = local_60.x2.m_i;
        QVar3.y2.m_i = local_60.y2.m_i;
        QVar3.x1.m_i = local_60.x1.m_i;
        QVar3.y1.m_i = local_60.y1.m_i;
        QVar2.x2.m_i = local_60.x2.m_i;
        QVar2.y2.m_i = local_60.y2.m_i;
        QVar2.x1.m_i = local_60.x1.m_i;
        QVar2.y1.m_i = local_60.y1.m_i;
        if (((-1 < (int)local_48) && (QVar2 = QVar3, -1 < (long)local_48)) &&
           (QVar2 = QVar4, local_38 != (undefined1 *)0x0)) {
          this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)(lVar1 + 0x260));
          local_60 = (QRect)(**(code **)(**(long **)(lVar1 + 0x260) + 0x1e0))
                                      (*(long **)(lVar1 + 0x260),&local_48);
          QWidget::update(this_00,&local_60);
          QVar2 = local_60;
        }
      }
    }
  }
  else {
    updateCell();
    QVar2.x2.m_i = local_60.x2.m_i;
    QVar2.y2.m_i = local_60.y2.m_i;
    QVar2.x1.m_i = local_60.x1.m_i;
    QVar2.y1.m_i = local_60.y1.m_i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  local_60 = QVar2;
  __stack_chk_fail();
}

Assistant:

void QCalendarWidget::updateCell(QDate date)
{
    if (Q_UNLIKELY(!date.isValid())) {
        qWarning("QCalendarWidget::updateCell: Invalid date");
        return;
    }

    if (!isVisible())
        return;

    Q_D(QCalendarWidget);
    int row, column;
    d->m_model->cellForDate(date, &row, &column);
    if (row == -1 || column == -1)
        return;

    QModelIndex modelIndex = d->m_model->index(row, column);
    if (!modelIndex.isValid())
        return;

    d->m_view->viewport()->update(d->m_view->visualRect(modelIndex));
}